

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint addChunk_IHDR(ucvector *out,uint w,uint h,LodePNGColorType colortype,uint bitdepth,
                  uint interlace_method)

{
  uint uVar1;
  uchar data [13];
  uchar local_15;
  undefined1 local_14;
  undefined1 local_13;
  undefined1 local_12;
  undefined1 local_11;
  undefined1 local_10;
  undefined1 local_f;
  undefined1 local_e;
  undefined1 local_d;
  undefined1 local_c;
  undefined2 local_b;
  undefined1 local_9;
  ulong uVar2;
  
  local_15 = (uchar)(w >> 0x18);
  local_14 = (undefined1)(w >> 0x10);
  local_13 = (undefined1)(w >> 8);
  local_12 = (undefined1)w;
  local_11 = (undefined1)(h >> 0x18);
  local_10 = (undefined1)(h >> 0x10);
  local_f = (undefined1)(h >> 8);
  local_e = (undefined1)h;
  local_d = (undefined1)bitdepth;
  local_c = (undefined1)colortype;
  local_b = 0;
  local_9 = (undefined1)interlace_method;
  uVar1 = lodepng_chunk_create(&out->data,&out->size,0xd,"IHDR",&local_15);
  uVar2 = (ulong)uVar1;
  if (uVar1 == 0) {
    uVar2 = out->size;
    out->allocsize = uVar2;
  }
  return (uint)uVar2;
}

Assistant:

static unsigned addChunk_IHDR(ucvector* out, unsigned w, unsigned h,
                              LodePNGColorType colortype, unsigned bitdepth, unsigned interlace_method) {
  unsigned char data[13];

  lodepng_set32bitInt(data + 0, w); /*width*/
  lodepng_set32bitInt(data + 4, h); /*height*/
  data[8] = (unsigned char)bitdepth; /*bit depth*/
  data[9] = (unsigned char)colortype; /*color type*/
  data[10] = 0; /*compression method*/
  data[11] = 0; /*filter method*/
  data[12] = interlace_method; /*interlace method*/

  return addChunk(out, "IHDR", data, sizeof(data));
}